

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderTextEllipsis
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,float clip_max_x,
               float ellipsis_max_x,char *text,char *text_end_full,ImVec2 *text_size_if_known)

{
  float fVar1;
  uint uVar2;
  ImFont *this;
  undefined1 auVar3 [16];
  undefined4 uVar4;
  undefined4 uVar5;
  char *text_end;
  ImDrawList *draw_list_00;
  uint uVar6;
  int iVar7;
  ImU32 col;
  ImFontGlyph *pIVar8;
  int iVar9;
  ImGuiContext *g;
  ImGuiContext *pIVar10;
  char *text_display_end;
  bool bVar11;
  float fVar12;
  undefined1 auVar14 [16];
  ImVec2 IVar13;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar15 [64];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float local_b0;
  char *text_end_ellipsis;
  float local_9c;
  ImVec2 local_98;
  float local_90;
  uint local_8c;
  uint unused;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  ImVec2 *local_68;
  char *local_60;
  undefined1 local_58 [16];
  ImGuiContext *local_48;
  ImDrawList *local_40;
  ImVec2 local_38;
  undefined1 extraout_var [56];
  
  pIVar10 = GImGui;
  local_58._4_4_ = in_XMM1_Db;
  local_58._0_4_ = ellipsis_max_x;
  local_58._8_4_ = in_XMM1_Dc;
  local_58._12_4_ = in_XMM1_Dd;
  if ((text_end_full == (char *)0x0) && (text_end_full = text, text != (char *)0xffffffffffffffff))
  {
    do {
      if (*text_end_full == '#') {
        if (text_end_full[1] == '#') goto LAB_0014dff3;
      }
      else if (*text_end_full == '\0') goto LAB_0014dff3;
      text_end_full = text_end_full + 1;
    } while (text_end_full != (char *)0xffffffffffffffff);
    text_end_full = (char *)0xffffffffffffffff;
  }
LAB_0014dff3:
  local_9c = clip_max_x;
  if (text_size_if_known == (ImVec2 *)0x0) {
    fVar1 = GImGui->FontSize;
    if (text_end_full == text) {
      auVar3 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x1d);
      local_98 = auVar3._0_8_;
    }
    else {
      auVar15._0_8_ =
           ImFont::CalcTextSizeA
                     (GImGui->Font,fVar1,3.4028235e+38,0.0,text,text_end_full,(char **)0x0);
      auVar15._8_56_ = extraout_var;
      auVar3 = vcvtdq2ps_avx(ZEXT416((uint)(int)(auVar15._0_4_ + 0.99999)));
      auVar14._4_12_ = auVar15._4_12_;
      auVar14._0_4_ = auVar3._0_4_;
      local_98 = auVar14._0_8_;
    }
  }
  else {
    local_98 = *text_size_if_known;
  }
  if (local_98.x <= pos_max->x - pos_min->x) {
    fStack_84 = pos_max->y;
    unused = (uint)local_9c;
    text_end_ellipsis = (char *)0x0;
    RenderTextClippedEx(draw_list,pos_min,(ImVec2 *)&unused,text,text_end_full,&local_98,
                        (ImVec2 *)&text_end_ellipsis,(ImRect *)0x0);
  }
  else {
    local_48 = pIVar10;
    this = draw_list->_Data->Font;
    fVar1 = draw_list->_Data->FontSize;
    text_end_ellipsis = (char *)0x0;
    uVar2._0_2_ = this->EllipsisChar;
    uVar2._2_1_ = this->DirtyLookupTables;
    uVar2._3_1_ = this->field_0x57;
    uVar6 = 0x2e;
    if ((undefined2)uVar2 != -1) {
      uVar6 = uVar2;
    }
    local_8c = uVar6 & 0xffff;
    local_68 = pos_min;
    pIVar8 = ImFont::FindGlyph(this,(ImWchar)uVar6);
    local_90 = pIVar8->X1;
    bVar11 = (undefined2)uVar2 == -1;
    iVar9 = bVar11 + 1 + (uint)bVar11;
    local_b0 = local_90;
    if (bVar11) {
      fVar12 = draw_list->_Data->FontSize / this->FontSize;
      local_b0 = fVar12 + (local_90 - pIVar8->X0);
      local_90 = local_b0 * (float)iVar9 - fVar12;
    }
    auVar3 = vcmpss_avx(local_58,ZEXT416((uint)pos_max->x),2);
    auVar3 = vblendvps_avx(local_58,ZEXT416((uint)pos_max->x),auVar3);
    auVar3 = vmaxss_avx(ZEXT416((uint)((auVar3._0_4_ - local_90) - local_68->x)),ZEXT416(0x3f800000)
                       );
    local_60 = text;
    local_40 = draw_list;
    IVar13 = ImFont::CalcTextSizeA
                       (this,fVar1,auVar3._0_4_,0.0,text,text_end_full,&text_end_ellipsis);
    local_78._8_8_ = extraout_XMM0_Qb;
    if (text_end_ellipsis < text_end_full && text_end_ellipsis == text) {
      _unused = (ImVec2)((ulong)_unused & 0xffffffff00000000);
      iVar7 = ImTextCharFromUtf8(&unused,text,text_end_full);
      text_end_ellipsis = text + iVar7;
      IVar13 = ImFont::CalcTextSizeA
                         (this,fVar1,3.4028235e+38,0.0,text,text_end_ellipsis,(char **)0x0);
      local_78._8_8_ = extraout_XMM0_Qb_00;
    }
    local_78._0_4_ = IVar13.x;
    local_78._4_4_ = IVar13.y;
    while ((draw_list_00 = local_40, pos_min = local_68, text_end = text_end_ellipsis,
           text < text_end_ellipsis &&
           ((text_end_ellipsis[-1] == ' ' || (text_end_ellipsis[-1] == '\t'))))) {
      text_end_ellipsis = text_end_ellipsis + -1;
      IVar13 = ImFont::CalcTextSizeA
                         (this,fVar1,3.4028235e+38,0.0,text_end_ellipsis,text_end,(char **)0x0);
      local_78 = ZEXT416((uint)((float)local_78._0_4_ - IVar13.x));
    }
    fStack_84 = pos_max->y;
    unused = (uint)local_9c;
    local_38.x = 0.0;
    local_38.y = 0.0;
    RenderTextClippedEx(local_40,local_68,(ImVec2 *)&unused,text,text_end_ellipsis,&local_98,
                        &local_38,(ImRect *)0x0);
    uVar2 = local_8c;
    fVar12 = (float)local_78._0_4_ + pos_min->x;
    pIVar10 = local_48;
    text = local_60;
    if (fVar12 + local_90 <= (float)local_58._0_4_) {
      do {
        local_78 = ZEXT416((uint)fVar12);
        local_58 = vinsertps_avx(local_78,ZEXT416((uint)pos_min->y),0x10);
        unused = (uint)(GImGui->Style).Colors[0].x;
        fStack_84 = (GImGui->Style).Colors[0].y;
        uVar4 = (GImGui->Style).Colors[0].z;
        uVar5 = (GImGui->Style).Colors[0].w;
        fStack_7c = (GImGui->Style).Alpha * (float)uVar5;
        fStack_80 = (float)uVar4;
        col = ColorConvertFloat4ToU32((ImVec4 *)&unused);
        ImFont::RenderChar(this,draw_list_00,fVar1,(ImVec2)local_58._0_8_,col,(ImWchar)uVar2);
        fVar12 = local_b0 + (float)local_78._0_4_;
        iVar9 = iVar9 + -1;
        pIVar10 = local_48;
        text = local_60;
      } while (iVar9 != 0);
    }
  }
  if (pIVar10->LogEnabled == true) {
    LogRenderedText(pos_min,text,text_end_full);
  }
  return;
}

Assistant:

void ImGui::RenderTextEllipsis(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, float clip_max_x, float ellipsis_max_x, const char* text, const char* text_end_full, const ImVec2* text_size_if_known)
{
    ImGuiContext& g = *GImGui;
    if (text_end_full == NULL)
        text_end_full = FindRenderedTextEnd(text);
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_end_full, false, 0.0f);

    //draw_list->AddLine(ImVec2(pos_max.x, pos_min.y - 4), ImVec2(pos_max.x, pos_max.y + 4), IM_COL32(0, 0, 255, 255));
    //draw_list->AddLine(ImVec2(ellipsis_max_x, pos_min.y-2), ImVec2(ellipsis_max_x, pos_max.y+2), IM_COL32(0, 255, 0, 255));
    //draw_list->AddLine(ImVec2(clip_max_x, pos_min.y), ImVec2(clip_max_x, pos_max.y), IM_COL32(255, 0, 0, 255));
    // FIXME: We could technically remove (last_glyph->AdvanceX - last_glyph->X1) from text_size.x here and save a few pixels.
    if (text_size.x > pos_max.x - pos_min.x)
    {
        // Hello wo...
        // |       |   |
        // min   max   ellipsis_max
        //          <-> this is generally some padding value

        const ImFont* font = draw_list->_Data->Font;
        const float font_size = draw_list->_Data->FontSize;
        const char* text_end_ellipsis = NULL;

        ImWchar ellipsis_char = font->EllipsisChar;
        int ellipsis_char_count = 1;
        if (ellipsis_char == (ImWchar)-1)
        {
            ellipsis_char = (ImWchar)'.';
            ellipsis_char_count = 3;
        }
        const ImFontGlyph* glyph = font->FindGlyph(ellipsis_char);

        float ellipsis_glyph_width = glyph->X1;                 // Width of the glyph with no padding on either side
        float ellipsis_total_width = ellipsis_glyph_width;      // Full width of entire ellipsis

        if (ellipsis_char_count > 1)
        {
            // Full ellipsis size without free spacing after it.
            const float spacing_between_dots = 1.0f * (draw_list->_Data->FontSize / font->FontSize);
            ellipsis_glyph_width = glyph->X1 - glyph->X0 + spacing_between_dots;
            ellipsis_total_width = ellipsis_glyph_width * (float)ellipsis_char_count - spacing_between_dots;
        }

        // We can now claim the space between pos_max.x and ellipsis_max.x
        const float text_avail_width = ImMax((ImMax(pos_max.x, ellipsis_max_x) - ellipsis_total_width) - pos_min.x, 1.0f);
        float text_size_clipped_x = font->CalcTextSizeA(font_size, text_avail_width, 0.0f, text, text_end_full, &text_end_ellipsis).x;
        if (text == text_end_ellipsis && text_end_ellipsis < text_end_full)
        {
            // Always display at least 1 character if there's no room for character + ellipsis
            text_end_ellipsis = text + ImTextCountUtf8BytesFromChar(text, text_end_full);
            text_size_clipped_x = font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text, text_end_ellipsis).x;
        }
        while (text_end_ellipsis > text && ImCharIsBlankA(text_end_ellipsis[-1]))
        {
            // Trim trailing space before ellipsis (FIXME: Supporting non-ascii blanks would be nice, for this we need a function to backtrack in UTF-8 text)
            text_end_ellipsis--;
            text_size_clipped_x -= font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text_end_ellipsis, text_end_ellipsis + 1).x; // Ascii blanks are always 1 byte
        }

        // Render text, render ellipsis
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_ellipsis, &text_size, ImVec2(0.0f, 0.0f));
        float ellipsis_x = pos_min.x + text_size_clipped_x;
        if (ellipsis_x + ellipsis_total_width <= ellipsis_max_x)
            for (int i = 0; i < ellipsis_char_count; i++)
            {
                font->RenderChar(draw_list, font_size, ImVec2(ellipsis_x, pos_min.y), GetColorU32(ImGuiCol_Text), ellipsis_char);
                ellipsis_x += ellipsis_glyph_width;
            }
    }
    else
    {
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_full, &text_size, ImVec2(0.0f, 0.0f));
    }

    if (g.LogEnabled)
        LogRenderedText(&pos_min, text, text_end_full);
}